

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O2

Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled> *
__thiscall
Lib::
Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
::pop(Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
      *__return_storage_ptr__,
     Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
     *this)

{
  Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled> *pRVar1
  ;
  
  pRVar1 = this->_cursor;
  this->_cursor = pRVar1 + -1;
  (__return_storage_ptr__->_self)._M_t.
  super___uniq_ptr_impl<Indexing::ClauseCodeTree::LiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
  .super__Head_base<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_false>._M_head_impl =
       pRVar1[-1]._self._M_t.
       super___uniq_ptr_impl<Indexing::ClauseCodeTree::LiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
       .super__Head_base<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_false>._M_head_impl;
  pRVar1[-1]._self._M_t.
  super___uniq_ptr_impl<Indexing::ClauseCodeTree::LiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
  .super__Head_base<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_false>._M_head_impl =
       (LiteralMatcher *)0x0;
  Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>::
  ~Recycled(this->_cursor);
  return __return_storage_ptr__;
}

Assistant:

inline
  C pop()
  {
    ASS(_cursor > _stack);
    _cursor--;

    C res = std::move(*_cursor);
    _cursor->~C();

    return res;
  }